

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void parse_mask_regressor_args
               (vw *all,string *feature_mask,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *initial_regressors)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  io_buf *in_RDX;
  io_buf *in_RSI;
  io_buf io_temp;
  io_buf io_temp_mask;
  string file_options;
  options_i *in_stack_00001050;
  string *in_stack_00001058;
  undefined1 in_stack_00001066;
  undefined1 in_stack_00001067;
  io_buf *in_stack_00001068;
  vw *in_stack_00001070;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 uVar4;
  learner<char,_char> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX);
    if (sVar3 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX,0);
      _Var1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      if (_Var1) goto LAB_00370880;
    }
    io_buf::io_buf((io_buf *)0x3706d8);
    std::__cxx11::string::c_str();
    io_buf::open_file((io_buf *)io_temp_mask.currentname._end,io_temp_mask.currentname._begin,
                      io_temp_mask.head._7_1_,(int)io_temp_mask.head);
    save_load_header(in_stack_00001070,in_stack_00001068,(bool)in_stack_00001067,
                     (bool)in_stack_00001066,in_stack_00001058,in_stack_00001050);
    LEARNER::learner<char,_char>::save_load
              (in_stack_fffffffffffffe60,in_RSI,SUB81((ulong)in_RDX >> 0x38,0),
               SUB81((ulong)in_RDX >> 0x30,0));
    io_buf::close_file((io_buf *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX);
    if (sVar3 != 0) {
      io_buf::io_buf((io_buf *)0x370779);
      uVar4 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDX,0);
      std::__cxx11::string::c_str();
      io_buf::open_file((io_buf *)io_temp_mask.currentname._end,io_temp_mask.currentname._begin,
                        io_temp_mask.head._7_1_,(int)io_temp_mask.head);
      save_load_header(in_stack_00001070,in_stack_00001068,(bool)in_stack_00001067,
                       (bool)in_stack_00001066,in_stack_00001058,in_stack_00001050);
      io_buf::close_file((io_buf *)CONCAT44(uVar4,in_stack_fffffffffffffe48));
      parameters::set_zero((parameters *)in_RDX,CONCAT44(uVar4,in_stack_fffffffffffffe48));
      io_buf::~io_buf(in_RDX);
    }
    io_buf::~io_buf(in_RDX);
  }
LAB_00370880:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void parse_mask_regressor_args(vw& all, std::string feature_mask, std::vector<std::string> initial_regressors)
{
  // TODO does this extra check need to be used? I think it is duplicated but there may be some logic I am missing.
  std::string file_options;
  if (!feature_mask.empty())
  {
    if (initial_regressors.size() > 0)
    {
      if (feature_mask == initial_regressors[0])  //-i and -mask are from same file, just generate mask
      {
        return;
      }
    }

    // all other cases, including from different file, or -i does not exist, need to read in the mask file
    io_buf io_temp_mask;
    io_temp_mask.open_file(feature_mask.c_str(), false, io_buf::READ);
    save_load_header(all, io_temp_mask, true, false, file_options, *all.options);
    all.l->save_load(io_temp_mask, true, false);
    io_temp_mask.close_file();

    // Deal with the over-written header from initial regressor
    if (initial_regressors.size() > 0)
    {
      // Load original header again.
      io_buf io_temp;
      io_temp.open_file(initial_regressors[0].c_str(), false, io_buf::READ);
      save_load_header(all, io_temp, true, false, file_options, *all.options);
      io_temp.close_file();

      // Re-zero the weights, in case weights of initial regressor use different indices
      all.weights.set_zero(0);
    }
    else
    {
      // If no initial regressor, just clear out the options loaded from the header.
      // TODO clear file options
      // all.opts_n_args.file_options.str("");
    }
  }
}